

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void __thiscall yy::mylanguage_parser::error(mylanguage_parser *this,syntax_error *yyexc)

{
  char *pcVar1;
  long *local_48 [2];
  long local_38 [2];
  allocator local_21;
  
  pcVar1 = (char *)(**(code **)(*(long *)yyexc + 0x10))(yyexc);
  std::__cxx11::string::string((string *)local_48,pcVar1,&local_21);
  (*this->_vptr_mylanguage_parser[3])(this,&yyexc->location,(string *)local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  return;
}

Assistant:

void
  mylanguage_parser::error (const syntax_error& yyexc)
  {
    error (yyexc.location, yyexc.what ());
  }